

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined8 *puVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  short sVar6;
  short sVar7;
  bool bVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  short sVar16;
  parasail_result_t *ppVar17;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  short sVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  char *pcVar24;
  short sVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  char *__format;
  uint uVar30;
  short sVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  undefined8 unaff_R13;
  int32_t i;
  ulong uVar39;
  bool bVar40;
  short sVar41;
  short sVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar49;
  short sVar50;
  short sVar56;
  short sVar57;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ushort uVar58;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ushort uVar67;
  short sVar68;
  ushort uVar69;
  undefined4 uVar70;
  short sVar75;
  ushort uVar76;
  short sVar77;
  ushort uVar78;
  short sVar79;
  ushort uVar80;
  short sVar81;
  ushort uVar82;
  short sVar83;
  ushort uVar84;
  short sVar85;
  ushort uVar86;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar87;
  ushort uVar88;
  short sVar89;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  short sVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  long lVar114;
  undefined1 auVar115 [16];
  long lVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  __m128i vWH;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  int32_t in_stack_fffffffffffffca8;
  uint local_324;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  short local_288;
  short sStack_286;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  short local_1b8;
  short sStack_1b6;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  short sVar120;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar24 = "_s2";
LAB_006d1fa4:
    fprintf(_stderr,__format,"parasail_nw_stats_rowcol_diag_sse41_128_16",pcVar24);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar24 = "s2Len";
    goto LAB_006d1fa4;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar24 = "open";
    goto LAB_006d1fa4;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar24 = "gap";
    goto LAB_006d1fa4;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar24 = "matrix";
    goto LAB_006d1fa4;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats_rowcol_diag_sse41_128_16");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar24 = "_s1";
      goto LAB_006d1fa4;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar24 = "_s1Len";
      goto LAB_006d1fa4;
    }
    if (matrix->type == 0) goto LAB_006d0e9c;
  }
  _s1Len = matrix->length;
LAB_006d0e9c:
  iVar26 = -open;
  iVar36 = matrix->min;
  iVar29 = -iVar36;
  if (iVar36 != iVar26 && SBORROW4(iVar36,iVar26) == iVar36 + open < 0) {
    iVar29 = open;
  }
  iVar36 = matrix->max;
  ppVar17 = parasail_result_new_rowcol3(_s1Len,s2Len);
  if (ppVar17 != (parasail_result_t *)0x0) {
    ppVar17->flag = ppVar17->flag | 0x8251001;
    ptr = parasail_memalign_int16_t(0x10,(long)(int)(_s1Len + 7));
    uVar37 = (ulong)(s2Len + 0xe);
    ptr_00 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_01 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_02 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_03 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_04 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_05 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_06 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_07 = parasail_memalign_int16_t(0x10,uVar37);
    ptr_08 = parasail_memalign_int16_t(0x10,uVar37);
    auVar73._0_8_ = -(ulong)(ptr == (int16_t *)0x0);
    auVar73._8_8_ = -(ulong)(ptr_00 == (int16_t *)0x0);
    auVar90._0_8_ = -(ulong)(ptr_01 == (int16_t *)0x0);
    auVar90._8_8_ = -(ulong)(ptr_02 == (int16_t *)0x0);
    auVar90 = packssdw(auVar73,auVar90);
    auVar71._0_8_ = -(ulong)(ptr_03 == (int16_t *)0x0);
    auVar71._8_8_ = -(ulong)(ptr_04 == (int16_t *)0x0);
    auVar59._0_8_ = -(ulong)(ptr_05 == (int16_t *)0x0);
    auVar59._8_8_ = -(ulong)(ptr_06 == (int16_t *)0x0);
    auVar59 = packssdw(auVar71,auVar59);
    auVar59 = packssdw(auVar90,auVar59);
    uVar37 = 0;
    if ((ptr_08 != (int16_t *)0x0 && ptr_07 != (int16_t *)0x0) &&
        ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]))
    {
      auVar59 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R13 >> 0x10),0x7ffe - (short)iVar36));
      sVar25 = (short)gap;
      sVar18 = (short)iVar26;
      sVar16 = (short)open;
      uVar33 = (ulong)(uint)s2Len;
      uVar35 = s2Len + 7;
      local_324 = _s1Len - 1;
      iVar36 = s2Len + -1;
      uVar38 = iVar29 - 0x7fff;
      auVar71 = pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
      uVar70 = auVar71._0_4_;
      local_288 = auVar71._0_2_;
      sStack_286 = auVar71._2_2_;
      auVar59 = pshuflw(auVar59,auVar59,0);
      uVar43 = auVar59._0_4_;
      auVar101._0_8_ = CONCAT44(uVar43,uVar43);
      auVar101._8_4_ = uVar43;
      auVar101._12_4_ = uVar43;
      auVar71 = pshuflw(auVar101,ZEXT416((uint)open),0);
      uVar43 = auVar71._0_4_;
      auVar71 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
      auVar48 = ZEXT216((ushort)uVar38) << 0x70;
      uVar44 = auVar71._0_4_;
      auVar72._4_4_ = uVar44;
      auVar72._0_4_ = uVar44;
      auVar72._8_4_ = uVar44;
      auVar72._12_4_ = uVar44;
      auVar71 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
      uVar44 = auVar71._0_4_;
      auVar104._4_4_ = uVar44;
      auVar104._0_4_ = uVar44;
      auVar104._8_4_ = uVar44;
      auVar104._12_4_ = uVar44;
      auVar91._8_4_ = 0xffffffff;
      auVar91._0_8_ = 0xffffffffffffffff;
      auVar91._12_4_ = 0xffffffff;
      auVar71 = paddsw(auVar104,auVar91);
      auVar90 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
      auVar60._0_4_ = auVar90._0_4_;
      auVar60._4_4_ = auVar60._0_4_;
      auVar60._8_4_ = auVar60._0_4_;
      auVar60._12_4_ = auVar60._0_4_;
      auVar90 = paddsw(auVar60,auVar91);
      auVar73 = psllw(auVar72,3);
      local_238._10_2_ = sVar18 + sVar25 * -2;
      local_238._8_2_ = sVar25 * -3 - sVar16;
      local_238._12_2_ = sVar18 - sVar25;
      local_238._14_2_ = sVar18;
      local_238._0_8_ =
           (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
           (ulong)(ushort)(sVar25 * -6 - sVar16) << 0x10 |
           (ulong)(ushort)(sVar25 * -5 - sVar16) << 0x20 |
           (ulong)(ushort)(sVar18 + sVar25 * -4) << 0x30;
      uVar21 = 0;
      if (0 < _s1Len) {
        uVar21 = (ulong)(uint)_s1Len;
      }
      for (; uVar21 != uVar37; uVar37 = uVar37 + 1) {
        ptr[uVar37] = (int16_t)matrix->mapper[(byte)_s1[uVar37]];
      }
      lVar22 = (long)_s1Len;
      for (lVar23 = lVar22; lVar23 < (int)(_s1Len + 7); lVar23 = lVar23 + 1) {
        ptr[lVar23] = 0;
      }
      piVar1 = matrix->mapper;
      for (uVar37 = 0; uVar33 != uVar37; uVar37 = uVar37 + 1) {
        ptr_00[uVar37 + 7] = (int16_t)piVar1[(byte)_s2[uVar37]];
      }
      for (lVar23 = 0; uVar37 = uVar33, lVar23 != 7; lVar23 = lVar23 + 1) {
        ptr_00[lVar23] = 0;
      }
      for (; (int)uVar37 < (int)uVar35; uVar37 = uVar37 + 1) {
        ptr_00[uVar37 + 7] = 0;
      }
      for (lVar23 = 0; uVar33 * 2 != lVar23; lVar23 = lVar23 + 2) {
        *(short *)((long)ptr_01 + lVar23 + 0xe) = (short)iVar26;
        *(undefined2 *)((long)ptr_02 + lVar23 + 0xe) = 0;
        *(undefined2 *)((long)ptr_03 + lVar23 + 0xe) = 0;
        *(undefined2 *)((long)ptr_04 + lVar23 + 0xe) = 0;
        *(ushort *)((long)ptr_05 + lVar23 + 0xe) = (ushort)uVar38;
        *(undefined2 *)((long)ptr_06 + lVar23 + 0xe) = 0;
        iVar26 = iVar26 - gap;
        *(undefined2 *)((long)ptr_07 + lVar23 + 0xe) = 0;
        *(undefined2 *)((long)ptr_08 + lVar23 + 0xe) = 0;
      }
      for (lVar23 = 0; lVar23 != 0xe; lVar23 = lVar23 + 2) {
        *(undefined2 *)((long)ptr_01 + lVar23) = 0;
        *(undefined2 *)((long)ptr_02 + lVar23) = 0;
        *(undefined2 *)((long)ptr_03 + lVar23) = 0;
        *(undefined2 *)((long)ptr_04 + lVar23) = 0;
        *(undefined2 *)((long)ptr_05 + lVar23) = 0;
        *(undefined2 *)((long)ptr_06 + lVar23) = 0;
        *(undefined2 *)((long)ptr_07 + lVar23) = 0;
        *(undefined2 *)((long)ptr_08 + lVar23) = 0;
      }
      for (lVar23 = 0; s2Len + (int)lVar23 < (int)uVar35; lVar23 = lVar23 + 1) {
        ptr_01[uVar33 + lVar23 + 7] = 0;
        ptr_02[uVar33 + lVar23 + 7] = 0;
        ptr_03[uVar33 + lVar23 + 7] = 0;
        ptr_04[uVar33 + lVar23 + 7] = 0;
        ptr_05[uVar33 + lVar23 + 7] = 0;
        ptr_06[uVar33 + lVar23 + 7] = 0;
        ptr_07[uVar33 + lVar23 + 7] = 0;
        ptr_08[uVar33 + lVar23 + 7] = 0;
      }
      ptr_01[6] = 0;
      uVar37 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar37 = 0;
      }
      auVar91 = pmovsxbw(local_238,0x1020304050607);
      uStack_1b0 = auVar101._8_8_;
      uStack_250 = uStack_1b0;
      auVar106._4_2_ = local_288;
      auVar106._0_4_ = uVar70;
      auVar106._6_2_ = sStack_286;
      auVar106._8_2_ = local_288;
      auVar106._10_2_ = sStack_286;
      auVar106._12_2_ = local_288;
      auVar106._14_2_ = sStack_286;
      uVar21 = 0;
      auVar113 = auVar106;
      auVar115 = auVar106;
      local_258 = auVar101._0_8_;
      local_248 = auVar106;
      local_228 = auVar106;
      while ((long)uVar21 < lVar22) {
        auVar101 = *(undefined1 (*) [16])(ptr + uVar21);
        if (matrix->type == 0) {
          uVar35 = (uint)auVar101._0_2_;
          uVar30 = (uint)auVar101._2_2_;
          uVar28 = (uint)auVar101._4_2_;
          uVar32 = (uint)auVar101._6_2_;
          uVar27 = (uint)auVar101._8_2_;
          uVar34 = (uint)auVar101._10_2_;
          uVar19 = (uint)auVar101._12_2_;
          uVar20 = (int)auVar101._14_2_;
        }
        else {
          uVar35 = (uint)uVar21;
          uVar30 = uVar35 | 1;
          if (lVar22 <= (long)(uVar21 | 1)) {
            uVar30 = local_324;
          }
          uVar28 = uVar35 | 2;
          if (lVar22 <= (long)(uVar21 | 2)) {
            uVar28 = local_324;
          }
          uVar32 = uVar35 | 3;
          if (lVar22 <= (long)(uVar21 | 3)) {
            uVar32 = local_324;
          }
          uVar27 = uVar35 | 4;
          if (lVar22 <= (long)(uVar21 | 4)) {
            uVar27 = local_324;
          }
          uVar34 = uVar35 | 5;
          if (lVar22 <= (long)(uVar21 | 5)) {
            uVar34 = local_324;
          }
          uVar19 = uVar35 | 6;
          if (lVar22 <= (long)(uVar21 | 6)) {
            uVar19 = local_324;
          }
          uVar20 = uVar35 | 7;
          if (lVar22 <= (long)(uVar21 | 7)) {
            uVar20 = local_324;
          }
        }
        piVar1 = matrix->matrix;
        iVar29 = matrix->size;
        auVar93 = ZEXT216((ushort)(sVar18 - (short)uVar21 * sVar25)) << 0x70;
        auVar105 = pshufb(auVar101,_DAT_008a40d0);
        uVar69 = ptr_01[6];
        ptr_01[6] = sVar18 - (short)(uVar21 + 8) * sVar25;
        local_168 = auVar71._0_2_;
        sStack_166 = auVar71._2_2_;
        sStack_164 = auVar71._4_2_;
        sStack_162 = auVar71._6_2_;
        sStack_160 = auVar71._8_2_;
        sStack_15e = auVar71._10_2_;
        sStack_15c = auVar71._12_2_;
        sStack_15a = auVar71._14_2_;
        local_1a8 = (undefined1  [16])0x0;
        auVar46._0_8_ = 0;
        uVar33 = 0;
        auVar92 = (undefined1  [16])0x0;
        auVar119 = (undefined1  [16])0x0;
        auVar60 = (undefined1  [16])0x0;
        local_c8 = 0;
        uStack_c0 = 0;
        auVar104 = (undefined1  [16])0x0;
        local_e8 = 0;
        uStack_e0 = 0;
        auVar131 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_218._8_8_ = 0xfffffffefffd;
        local_218._0_8_ = 0xfffcfffbfffafff9;
        local_188 = CONCAT26(sStack_286,CONCAT24(local_288,uVar70));
        uStack_180 = CONCAT26(sStack_286,CONCAT24(local_288,uVar70));
        auVar101 = ZEXT216(uVar69) << 0x70;
        local_278._0_8_ = 0;
        local_278._8_8_ = 0;
        local_2a8 = auVar48;
        local_198 = auVar48;
        for (uVar39 = 0; uVar37 != uVar39; uVar39 = uVar39 + 1) {
          auVar45._0_8_ = auVar93._2_8_;
          auVar45._8_8_ = auVar93._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar39 + 7] << 0x30;
          local_268._8_8_ = uVar33;
          local_268._0_8_ = auVar46._0_8_;
          auVar108._0_8_ = auVar92._2_8_;
          uVar4 = auVar92._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar39 + 7] << 0x30;
          auVar108._8_8_ = uVar4;
          local_2e8._8_8_ = uStack_c0;
          local_2e8._0_8_ = local_c8;
          local_2f8._8_8_ = uStack_e0;
          local_2f8._0_8_ = local_e8;
          auVar117._0_8_ = auVar119._2_8_;
          uVar5 = auVar119._8_8_ >> 0x10 | (ulong)(ushort)ptr_03[uVar39 + 7] << 0x30;
          auVar117._8_8_ = uVar5;
          auVar74._0_8_ = local_2a8._2_8_;
          auVar74._8_8_ = local_2a8._8_8_ >> 0x10 | (ulong)(ushort)ptr_05[uVar39 + 7] << 0x30;
          auVar132._0_8_ = auVar131._2_8_;
          auVar132._8_8_ = auVar131._8_8_ >> 0x10 | (ulong)(ushort)ptr_06[uVar39 + 7] << 0x30;
          auVar107._0_8_ = local_2b8._2_8_;
          auVar107._8_8_ = local_2b8._8_8_ >> 0x10 | (ulong)(ushort)ptr_07[uVar39 + 7] << 0x30;
          auVar121._4_4_ = uVar43;
          auVar121._0_4_ = uVar43;
          auVar121._8_4_ = uVar43;
          auVar121._12_4_ = uVar43;
          auVar46 = psubsw(auVar45,auVar121);
          auVar131 = psubsw(auVar74,auVar72);
          sVar41 = auVar46._0_2_;
          sVar68 = auVar131._0_2_;
          auVar118._0_2_ = -(ushort)(sVar68 < sVar41);
          sVar49 = auVar46._2_2_;
          sVar75 = auVar131._2_2_;
          auVar118._2_2_ = -(ushort)(sVar75 < sVar49);
          sVar51 = auVar46._4_2_;
          sVar77 = auVar131._4_2_;
          auVar118._4_2_ = -(ushort)(sVar77 < sVar51);
          sVar52 = auVar46._6_2_;
          sVar79 = auVar131._6_2_;
          auVar118._6_2_ = -(ushort)(sVar79 < sVar52);
          sVar53 = auVar46._8_2_;
          sVar81 = auVar131._8_2_;
          auVar118._8_2_ = -(ushort)(sVar81 < sVar53);
          sVar54 = auVar46._10_2_;
          sVar83 = auVar131._10_2_;
          auVar118._10_2_ = -(ushort)(sVar83 < sVar54);
          sVar55 = auVar46._12_2_;
          sVar85 = auVar131._12_2_;
          sVar56 = auVar46._14_2_;
          auVar118._12_2_ = -(ushort)(sVar85 < sVar55);
          sVar87 = auVar131._14_2_;
          auVar118._14_2_ = -(ushort)(sVar87 < sVar56);
          auVar131 = pblendvb(auVar132,auVar108,auVar118);
          local_2b8 = pblendvb(auVar107,auVar117,auVar118);
          auVar46._0_8_ = auVar60._2_8_;
          uVar33 = auVar60._8_8_ >> 0x10 | (ulong)(ushort)ptr_04[uVar39 + 7] << 0x30;
          auVar46._8_8_ = uVar33;
          auVar109._0_8_ = local_2c8._2_8_;
          auVar109._8_8_ = local_2c8._8_8_ >> 0x10 | (ulong)(ushort)ptr_08[uVar39 + 7] << 0x30;
          auVar110 = pblendvb(auVar109,auVar46,auVar118);
          auVar121 = psubsw(auVar93,auVar121);
          auVar93 = psubsw(local_198,auVar72);
          sVar89 = auVar93._0_2_;
          sVar120 = auVar121._0_2_;
          auVar122._0_2_ = -(ushort)(sVar89 < sVar120);
          sVar94 = auVar93._2_2_;
          sVar124 = auVar121._2_2_;
          auVar122._2_2_ = -(ushort)(sVar94 < sVar124);
          sVar95 = auVar93._4_2_;
          sVar125 = auVar121._4_2_;
          auVar122._4_2_ = -(ushort)(sVar95 < sVar125);
          sVar96 = auVar93._6_2_;
          sVar126 = auVar121._6_2_;
          auVar122._6_2_ = -(ushort)(sVar96 < sVar126);
          sVar97 = auVar93._8_2_;
          sVar127 = auVar121._8_2_;
          auVar122._8_2_ = -(ushort)(sVar97 < sVar127);
          sVar98 = auVar93._10_2_;
          sVar128 = auVar121._10_2_;
          auVar122._10_2_ = -(ushort)(sVar98 < sVar128);
          sVar99 = auVar93._12_2_;
          sVar129 = auVar121._12_2_;
          sVar130 = auVar121._14_2_;
          auVar122._12_2_ = -(ushort)(sVar99 < sVar129);
          sVar100 = auVar93._14_2_;
          auVar122._14_2_ = -(ushort)(sVar100 < sVar130);
          auVar121 = pblendvb(local_2e8,auVar92,auVar122);
          auVar104 = pblendvb(auVar104,auVar119,auVar122);
          auVar119._10_2_ = (short)piVar1[(long)(int)(uVar28 * iVar29) + (long)ptr_00[uVar39 + 5]];
          auVar119._8_2_ = (short)piVar1[(long)(int)(uVar32 * iVar29) + (long)ptr_00[uVar39 + 4]];
          auVar119._12_2_ = (short)piVar1[(long)(int)(uVar30 * iVar29) + (long)ptr_00[uVar39 + 6]];
          sVar31 = local_188._2_2_;
          sVar6 = local_188._4_2_;
          sVar42 = local_188._6_2_;
          sVar7 = (short)uStack_180;
          sVar50 = uStack_180._2_2_;
          sVar57 = uStack_180._4_2_;
          sVar10 = uStack_180._6_2_;
          sVar16 = ptr_00[uVar39 + 7];
          auVar119._14_2_ = (short)piVar1[(long)(int)(uVar35 * iVar29) + (long)sVar16];
          auVar119._0_8_ =
               (ulong)(uint)piVar1[(long)(int)(uVar20 * iVar29) + (long)ptr_00[uVar39]] &
               0xffffffff0000ffff |
               (ulong)*(ushort *)(piVar1 + (long)(int)(uVar19 * iVar29) + (long)ptr_00[uVar39 + 1])
               << 0x10 | (ulong)*(ushort *)
                                 (piVar1 + (long)(int)(uVar34 * iVar29) + (long)ptr_00[uVar39 + 2])
                         << 0x20 |
               (ulong)*(ushort *)(piVar1 + (long)(int)(uVar27 * iVar29) + (long)ptr_00[uVar39 + 3])
               << 0x30;
          local_2a8._0_2_ = (ushort)(sVar41 < sVar68) * sVar68 | (ushort)(sVar41 >= sVar68) * sVar41
          ;
          local_2a8._2_2_ = (ushort)(sVar49 < sVar75) * sVar75 | (ushort)(sVar49 >= sVar75) * sVar49
          ;
          local_2a8._4_2_ = (ushort)(sVar51 < sVar77) * sVar77 | (ushort)(sVar51 >= sVar77) * sVar51
          ;
          local_2a8._6_2_ = (ushort)(sVar52 < sVar79) * sVar79 | (ushort)(sVar52 >= sVar79) * sVar52
          ;
          local_2a8._8_2_ = (ushort)(sVar53 < sVar81) * sVar81 | (ushort)(sVar53 >= sVar81) * sVar53
          ;
          local_2a8._10_2_ =
               (ushort)(sVar54 < sVar83) * sVar83 | (ushort)(sVar54 >= sVar83) * sVar54;
          local_2a8._12_2_ =
               (ushort)(sVar55 < sVar85) * sVar85 | (ushort)(sVar55 >= sVar85) * sVar55;
          local_2a8._14_2_ =
               (ushort)(sVar56 < sVar87) * sVar87 | (ushort)(sVar56 >= sVar87) * sVar56;
          auVar111._0_2_ =
               (ushort)(sVar120 < sVar89) * sVar89 | (ushort)(sVar120 >= sVar89) * sVar120;
          auVar111._2_2_ =
               (ushort)(sVar124 < sVar94) * sVar94 | (ushort)(sVar124 >= sVar94) * sVar124;
          auVar111._4_2_ =
               (ushort)(sVar125 < sVar95) * sVar95 | (ushort)(sVar125 >= sVar95) * sVar125;
          auVar111._6_2_ =
               (ushort)(sVar126 < sVar96) * sVar96 | (ushort)(sVar126 >= sVar96) * sVar126;
          auVar111._8_2_ =
               (ushort)(sVar127 < sVar97) * sVar97 | (ushort)(sVar127 >= sVar97) * sVar127;
          auVar111._10_2_ =
               (ushort)(sVar128 < sVar98) * sVar98 | (ushort)(sVar128 >= sVar98) * sVar128;
          auVar111._12_2_ =
               (ushort)(sVar129 < sVar99) * sVar99 | (ushort)(sVar129 >= sVar99) * sVar129;
          auVar111._14_2_ =
               (ushort)(sVar130 < sVar100) * sVar100 | (ushort)(sVar130 >= sVar100) * sVar130;
          auVar60 = pblendvb(local_2f8,auVar60,auVar122);
          auVar101 = paddsw(auVar101,auVar119);
          uVar61 = auVar101._0_2_;
          uVar69 = ((short)uVar61 < (short)auVar111._0_2_) * auVar111._0_2_ |
                   ((short)uVar61 >= (short)auVar111._0_2_) * uVar61;
          uVar62 = auVar101._2_2_;
          uVar76 = ((short)uVar62 < (short)auVar111._2_2_) * auVar111._2_2_ |
                   ((short)uVar62 >= (short)auVar111._2_2_) * uVar62;
          uVar64 = auVar101._4_2_;
          uVar78 = ((short)uVar64 < (short)auVar111._4_2_) * auVar111._4_2_ |
                   ((short)uVar64 >= (short)auVar111._4_2_) * uVar64;
          uVar66 = auVar101._6_2_;
          uVar80 = ((short)uVar66 < (short)auVar111._6_2_) * auVar111._6_2_ |
                   ((short)uVar66 >= (short)auVar111._6_2_) * uVar66;
          uVar58 = auVar101._8_2_;
          uVar82 = ((short)uVar58 < (short)auVar111._8_2_) * auVar111._8_2_ |
                   ((short)uVar58 >= (short)auVar111._8_2_) * uVar58;
          uVar63 = auVar101._10_2_;
          uVar84 = ((short)uVar63 < (short)auVar111._10_2_) * auVar111._10_2_ |
                   ((short)uVar63 >= (short)auVar111._10_2_) * uVar63;
          uVar65 = auVar101._12_2_;
          uVar67 = auVar101._14_2_;
          uVar86 = ((short)uVar65 < (short)auVar111._12_2_) * auVar111._12_2_ |
                   ((short)uVar65 >= (short)auVar111._12_2_) * uVar65;
          uVar88 = ((short)uVar67 < (short)auVar111._14_2_) * auVar111._14_2_ |
                   ((short)uVar67 >= (short)auVar111._14_2_) * uVar67;
          auVar123._0_2_ =
               (ushort)((short)uVar69 < (short)local_2a8._0_2_) * local_2a8._0_2_ |
               ((short)uVar69 >= (short)local_2a8._0_2_) * uVar69;
          auVar123._2_2_ =
               (ushort)((short)uVar76 < (short)local_2a8._2_2_) * local_2a8._2_2_ |
               ((short)uVar76 >= (short)local_2a8._2_2_) * uVar76;
          auVar123._4_2_ =
               (ushort)((short)uVar78 < (short)local_2a8._4_2_) * local_2a8._4_2_ |
               ((short)uVar78 >= (short)local_2a8._4_2_) * uVar78;
          auVar123._6_2_ =
               (ushort)((short)uVar80 < (short)local_2a8._6_2_) * local_2a8._6_2_ |
               ((short)uVar80 >= (short)local_2a8._6_2_) * uVar80;
          auVar123._8_2_ =
               (ushort)((short)uVar82 < (short)local_2a8._8_2_) * local_2a8._8_2_ |
               ((short)uVar82 >= (short)local_2a8._8_2_) * uVar82;
          auVar123._10_2_ =
               (ushort)((short)uVar84 < (short)local_2a8._10_2_) * local_2a8._10_2_ |
               ((short)uVar84 >= (short)local_2a8._10_2_) * uVar84;
          auVar123._12_2_ =
               (ushort)((short)uVar86 < (short)local_2a8._12_2_) * local_2a8._12_2_ |
               ((short)uVar86 >= (short)local_2a8._12_2_) * uVar86;
          auVar123._14_2_ =
               (ushort)((short)uVar88 < (short)local_2a8._14_2_) * local_2a8._14_2_ |
               ((short)uVar88 >= (short)local_2a8._14_2_) * uVar88;
          auVar102._0_2_ = -(ushort)(uVar61 == auVar123._0_2_);
          auVar102._2_2_ = -(ushort)(uVar62 == auVar123._2_2_);
          auVar102._4_2_ = -(ushort)(uVar64 == auVar123._4_2_);
          auVar102._6_2_ = -(ushort)(uVar66 == auVar123._6_2_);
          auVar102._8_2_ = -(ushort)(uVar58 == auVar123._8_2_);
          auVar102._10_2_ = -(ushort)(uVar63 == auVar123._10_2_);
          auVar102._12_2_ = -(ushort)(uVar65 == auVar123._12_2_);
          auVar102._14_2_ = -(ushort)(uVar67 == auVar123._14_2_);
          auVar93._0_2_ = -(ushort)((short)local_2a8._0_2_ < (short)uVar69);
          auVar93._2_2_ = -(ushort)((short)local_2a8._2_2_ < (short)uVar76);
          auVar93._4_2_ = -(ushort)((short)local_2a8._4_2_ < (short)uVar78);
          auVar93._6_2_ = -(ushort)((short)local_2a8._6_2_ < (short)uVar80);
          auVar93._8_2_ = -(ushort)((short)local_2a8._8_2_ < (short)uVar82);
          auVar93._10_2_ = -(ushort)((short)local_2a8._10_2_ < (short)uVar84);
          auVar93._12_2_ = -(ushort)((short)local_2a8._12_2_ < (short)uVar86);
          auVar93._14_2_ = -(ushort)((short)local_2a8._14_2_ < (short)uVar88);
          auVar119 = pblendvb(auVar131,auVar121,auVar93);
          local_f8 = auVar105._0_2_;
          sStack_f6 = auVar105._2_2_;
          sStack_f4 = auVar105._4_2_;
          sStack_f2 = auVar105._6_2_;
          sStack_f0 = auVar105._8_2_;
          sStack_ee = auVar105._10_2_;
          sStack_ec = auVar105._12_2_;
          sStack_ea = auVar105._14_2_;
          uVar15 = (ulong)local_188 >> 0x10;
          local_188 = CONCAT26((short)uStack_180,(int6)uVar15);
          uVar15 = (ulong)uStack_180 >> 0x10;
          uStack_180 = CONCAT26(sVar16,(int6)uVar15);
          auVar92._0_2_ = (ushort)-(ushort)(local_f8 == sVar31) >> 0xf;
          auVar92._2_2_ = (ushort)-(ushort)(sStack_f6 == sVar6) >> 0xf;
          auVar92._4_2_ = (ushort)-(ushort)(sStack_f4 == sVar42) >> 0xf;
          auVar92._6_2_ = (ushort)-(ushort)(sStack_f2 == sVar7) >> 0xf;
          auVar92._8_2_ = (ushort)-(ushort)(sStack_f0 == sVar50) >> 0xf;
          auVar92._10_2_ = (ushort)-(ushort)(sStack_ee == sVar57) >> 0xf;
          auVar92._12_2_ = (ushort)-(ushort)(sStack_ec == sVar10) >> 0xf;
          auVar92._14_2_ = (ushort)-(ushort)(sStack_ea == sVar16) >> 0xf;
          auVar101 = paddsw(local_278,auVar92);
          auVar92 = pblendvb(auVar119,auVar101,auVar102);
          auVar119 = pblendvb(local_2b8,auVar104,auVar93);
          auVar112._0_2_ =
               (ushort)-(ushort)(0 < (short)((ulong)(uint)piVar1[(long)(int)(uVar20 * iVar29) +
                                                                 (long)ptr_00[uVar39]] &
                                            0xffffffff0000ffff)) >> 0xf;
          auVar112._2_2_ =
               (ushort)-(ushort)(0 < (short)*(ushort *)
                                             (piVar1 + (long)(int)(uVar19 * iVar29) +
                                                       (long)ptr_00[uVar39 + 1])) >> 0xf;
          auVar112._4_2_ =
               (ushort)-(ushort)(0 < (short)*(ushort *)
                                             (piVar1 + (long)(int)(uVar34 * iVar29) +
                                                       (long)ptr_00[uVar39 + 2])) >> 0xf;
          auVar112._6_2_ =
               (ushort)-(ushort)(0 < (short)*(ushort *)
                                             (piVar1 + (long)(int)(uVar27 * iVar29) +
                                                       (long)ptr_00[uVar39 + 3])) >> 0xf;
          auVar112._8_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar32 * iVar29) +
                                                   (long)ptr_00[uVar39 + 4]]) >> 0xf;
          auVar112._10_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar28 * iVar29) +
                                                   (long)ptr_00[uVar39 + 5]]) >> 0xf;
          auVar112._12_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar30 * iVar29) +
                                                   (long)ptr_00[uVar39 + 6]]) >> 0xf;
          auVar112._14_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar35 * iVar29) + (long)sVar16]) >>
               0xf;
          auVar101 = paddsw(local_1a8,auVar112);
          auVar119 = pblendvb(auVar119,auVar101,auVar102);
          auVar101 = pmovsxbw(auVar112,0x101010101010101);
          local_2c8 = paddsw(auVar110,auVar101);
          auVar118 = paddsw(auVar60,auVar101);
          auVar60 = pblendvb(local_2c8,auVar118,auVar93);
          auVar101 = paddsw(local_268,auVar101);
          auVar60 = pblendvb(auVar60,auVar101,auVar102);
          auVar103._0_2_ = -(ushort)(local_218._0_2_ == -1);
          auVar103._2_2_ = -(ushort)(local_218._2_2_ == -1);
          auVar103._4_2_ = -(ushort)(local_218._4_2_ == -1);
          auVar103._6_2_ = -(ushort)(local_218._6_2_ == -1);
          auVar103._8_2_ = -(ushort)(local_218._8_2_ == -1);
          auVar103._10_2_ = -(ushort)(local_218._10_2_ == -1);
          auVar103._12_2_ = -(ushort)(local_218._12_2_ == -1);
          auVar103._14_2_ = -(ushort)(local_218._14_2_ == -1);
          auVar93 = pblendvb(auVar123,local_238,auVar103);
          auVar92 = ~auVar103 & auVar92;
          auVar119 = ~auVar103 & auVar119;
          auVar60 = ~auVar103 & auVar60;
          auVar110._4_2_ = local_288;
          auVar110._0_4_ = uVar70;
          auVar110._6_2_ = sStack_286;
          auVar110._8_2_ = local_288;
          auVar110._10_2_ = sStack_286;
          auVar110._12_2_ = local_288;
          auVar110._14_2_ = sStack_286;
          local_198 = pblendvb(auVar111,auVar110,auVar103);
          sVar6 = auVar93._0_2_;
          sVar16 = auVar92._0_2_;
          sVar31 = auVar60._0_2_;
          sVar42 = auVar119._0_2_;
          if (7 < uVar39) {
            bVar40 = sVar6 < (short)local_258;
            uVar61 = (ushort)!bVar40 * (short)local_258;
            sVar7 = auVar93._2_2_;
            bVar8 = sVar7 < local_258._2_2_;
            uVar69 = (ushort)!bVar8 * local_258._2_2_;
            sVar50 = auVar93._4_2_;
            bVar9 = sVar50 < local_258._4_2_;
            uVar62 = (ushort)!bVar9 * local_258._4_2_;
            sVar57 = auVar93._6_2_;
            sVar10 = auVar93._8_2_;
            bVar11 = sVar10 < (short)uStack_250;
            uVar76 = (ushort)!bVar11 * (short)uStack_250;
            sVar41 = auVar93._10_2_;
            bVar12 = sVar41 < uStack_250._2_2_;
            uVar64 = (ushort)!bVar12 * uStack_250._2_2_;
            sVar49 = auVar93._12_2_;
            bVar13 = sVar49 < uStack_250._4_2_;
            uVar78 = (ushort)!bVar13 * uStack_250._4_2_;
            sVar51 = auVar93._14_2_;
            local_258 = CONCAT26((ushort)(sVar57 < local_258._6_2_) * sVar57 |
                                 (ushort)(sVar57 >= local_258._6_2_) * local_258._6_2_,
                                 CONCAT24((ushort)bVar9 * sVar50 | uVar62,
                                          CONCAT22((ushort)bVar8 * sVar7 | uVar69,
                                                   (ushort)bVar40 * sVar6 | uVar61)));
            uStack_250 = CONCAT26((ushort)(sVar51 < uStack_250._6_2_) * sVar51 |
                                  (ushort)(sVar51 >= uStack_250._6_2_) * uStack_250._6_2_,
                                  CONCAT24((ushort)bVar13 * sVar49 | uVar78,
                                           CONCAT22((ushort)bVar12 * sVar41 | uVar64,
                                                    (ushort)bVar11 * sVar10 | uVar76)));
            uVar69 = (ushort)((short)local_248._0_2_ < sVar6) * sVar6 |
                     (ushort)((short)local_248._0_2_ >= sVar6) * local_248._0_2_;
            uVar61 = (ushort)((short)local_248._2_2_ < sVar7) * sVar7 |
                     (ushort)((short)local_248._2_2_ >= sVar7) * local_248._2_2_;
            uVar62 = (ushort)((short)local_248._4_2_ < sVar50) * sVar50 |
                     (ushort)((short)local_248._4_2_ >= sVar50) * local_248._4_2_;
            uVar76 = (ushort)((short)local_248._6_2_ < sVar57) * sVar57 |
                     (ushort)((short)local_248._6_2_ >= sVar57) * local_248._6_2_;
            uVar64 = (ushort)((short)local_248._8_2_ < sVar10) * sVar10 |
                     (ushort)((short)local_248._8_2_ >= sVar10) * local_248._8_2_;
            uVar78 = (ushort)((short)local_248._10_2_ < sVar41) * sVar41 |
                     (ushort)((short)local_248._10_2_ >= sVar41) * local_248._10_2_;
            uVar66 = (ushort)((short)local_248._12_2_ < sVar49) * sVar49 |
                     (ushort)((short)local_248._12_2_ >= sVar49) * local_248._12_2_;
            uVar80 = (ushort)((short)local_248._14_2_ < sVar51) * sVar51 |
                     (ushort)((short)local_248._14_2_ >= sVar51) * local_248._14_2_;
            uVar58 = (ushort)((short)uVar69 < sVar16) * sVar16 | ((short)uVar69 >= sVar16) * uVar69;
            sVar7 = auVar92._2_2_;
            uVar82 = (ushort)((short)uVar61 < sVar7) * sVar7 | ((short)uVar61 >= sVar7) * uVar61;
            sVar7 = auVar92._4_2_;
            uVar63 = (ushort)((short)uVar62 < sVar7) * sVar7 | ((short)uVar62 >= sVar7) * uVar62;
            sVar7 = auVar92._6_2_;
            uVar84 = (ushort)((short)uVar76 < sVar7) * sVar7 | ((short)uVar76 >= sVar7) * uVar76;
            sVar7 = auVar92._8_2_;
            uVar65 = (ushort)((short)uVar64 < sVar7) * sVar7 | ((short)uVar64 >= sVar7) * uVar64;
            sVar7 = auVar92._10_2_;
            uVar86 = (ushort)((short)uVar78 < sVar7) * sVar7 | ((short)uVar78 >= sVar7) * uVar78;
            sVar7 = auVar92._12_2_;
            uVar88 = (ushort)((short)uVar66 < sVar7) * sVar7 | ((short)uVar66 >= sVar7) * uVar66;
            sVar7 = auVar92._14_2_;
            uVar67 = (ushort)((short)uVar80 < sVar7) * sVar7 | ((short)uVar80 >= sVar7) * uVar80;
            uVar69 = (ushort)(sVar42 < sVar31) * sVar31 | (ushort)(sVar42 >= sVar31) * sVar42;
            sVar7 = auVar60._2_2_;
            sVar50 = auVar119._2_2_;
            uVar61 = (ushort)(sVar50 < sVar7) * sVar7 | (ushort)(sVar50 >= sVar7) * sVar50;
            sVar7 = auVar60._4_2_;
            sVar50 = auVar119._4_2_;
            uVar62 = (ushort)(sVar50 < sVar7) * sVar7 | (ushort)(sVar50 >= sVar7) * sVar50;
            sVar7 = auVar60._6_2_;
            sVar50 = auVar119._6_2_;
            uVar76 = (ushort)(sVar50 < sVar7) * sVar7 | (ushort)(sVar50 >= sVar7) * sVar50;
            sVar7 = auVar60._8_2_;
            sVar50 = auVar119._8_2_;
            uVar64 = (ushort)(sVar50 < sVar7) * sVar7 | (ushort)(sVar50 >= sVar7) * sVar50;
            sVar7 = auVar60._10_2_;
            sVar50 = auVar119._10_2_;
            uVar78 = (ushort)(sVar50 < sVar7) * sVar7 | (ushort)(sVar50 >= sVar7) * sVar50;
            sVar7 = auVar60._12_2_;
            sVar50 = auVar119._12_2_;
            sVar57 = auVar119._14_2_;
            uVar66 = (ushort)(sVar50 < sVar7) * sVar7 | (ushort)(sVar50 >= sVar7) * sVar50;
            sVar7 = auVar60._14_2_;
            uVar80 = (ushort)(sVar57 < sVar7) * sVar7 | (ushort)(sVar57 >= sVar7) * sVar57;
            local_248._2_2_ =
                 ((short)uVar82 < (short)uVar61) * uVar61 |
                 ((short)uVar82 >= (short)uVar61) * uVar82;
            local_248._0_2_ =
                 ((short)uVar58 < (short)uVar69) * uVar69 |
                 ((short)uVar58 >= (short)uVar69) * uVar58;
            local_248._4_2_ =
                 ((short)uVar63 < (short)uVar62) * uVar62 |
                 ((short)uVar63 >= (short)uVar62) * uVar63;
            local_248._6_2_ =
                 ((short)uVar84 < (short)uVar76) * uVar76 |
                 ((short)uVar84 >= (short)uVar76) * uVar84;
            local_248._8_2_ =
                 ((short)uVar65 < (short)uVar64) * uVar64 |
                 ((short)uVar65 >= (short)uVar64) * uVar65;
            local_248._10_2_ =
                 ((short)uVar86 < (short)uVar78) * uVar78 |
                 ((short)uVar86 >= (short)uVar78) * uVar86;
            local_248._12_2_ =
                 ((short)uVar88 < (short)uVar66) * uVar66 |
                 ((short)uVar88 >= (short)uVar66) * uVar88;
            local_248._14_2_ =
                 ((short)uVar67 < (short)uVar80) * uVar80 |
                 ((short)uVar67 >= (short)uVar80) * uVar67;
          }
          auVar104 = ~auVar103 & auVar104;
          auVar101 = ~auVar103 & auVar118;
          puVar2 = (undefined8 *)((ppVar17->field_4).trace)->trace_del_table;
          vWH[0] = uVar21 & 0xffffffff;
          i = (int32_t)uVar39;
          vWH[1]._0_4_ = _s1Len;
          vWH[1]._4_4_ = 0;
          arr_store_rowcol((int *)*puVar2,(int *)puVar2[4],vWH,i,s2Len,in_stack_fffffffffffffca8,
                           (int32_t)ptr_07);
          pvVar3 = ((ppVar17->field_4).trace)->trace_del_table;
          vWH_00[0] = uVar21 & 0xffffffff;
          vWH_00[1]._0_4_ = _s1Len;
          vWH_00[1]._4_4_ = 0;
          arr_store_rowcol(*(int **)((long)pvVar3 + 8),*(int **)((long)pvVar3 + 0x28),vWH_00,i,s2Len
                           ,in_stack_fffffffffffffca8,(int32_t)ptr_07);
          pvVar3 = ((ppVar17->field_4).trace)->trace_del_table;
          vWH_01[0] = uVar21 & 0xffffffff;
          vWH_01[1]._0_4_ = _s1Len;
          vWH_01[1]._4_4_ = 0;
          arr_store_rowcol(*(int **)((long)pvVar3 + 0x10),*(int **)((long)pvVar3 + 0x30),vWH_01,i,
                           s2Len,in_stack_fffffffffffffca8,(int32_t)ptr_07);
          pvVar3 = ((ppVar17->field_4).trace)->trace_del_table;
          vWH_02[0] = uVar21 & 0xffffffff;
          vWH_02[1]._0_4_ = _s1Len;
          vWH_02[1]._4_4_ = 0;
          arr_store_rowcol(*(int **)((long)pvVar3 + 0x18),*(int **)((long)pvVar3 + 0x38),vWH_02,i,
                           s2Len,in_stack_fffffffffffffca8,(int32_t)ptr_07);
          local_138 = auVar90._0_2_;
          sStack_136 = auVar90._2_2_;
          sStack_134 = auVar90._4_2_;
          sStack_132 = auVar90._6_2_;
          sStack_130 = auVar90._8_2_;
          sStack_12e = auVar90._10_2_;
          sStack_12c = auVar90._12_2_;
          sStack_12a = auVar90._14_2_;
          auVar47._0_2_ = -(ushort)(local_218._0_2_ == local_138);
          auVar47._2_2_ = -(ushort)(local_218._2_2_ == sStack_136);
          auVar47._4_2_ = -(ushort)(local_218._4_2_ == sStack_134);
          auVar47._6_2_ = -(ushort)(local_218._6_2_ == sStack_132);
          auVar47._8_2_ = -(ushort)(local_218._8_2_ == sStack_130);
          auVar47._10_2_ = -(ushort)(local_218._10_2_ == sStack_12e);
          auVar47._12_2_ = -(ushort)(local_218._12_2_ == sStack_12c);
          auVar47._14_2_ = -(ushort)(local_218._14_2_ == sStack_12a);
          auVar14._2_2_ = -(ushort)(auVar91._2_2_ == sStack_166);
          auVar14._0_2_ = -(ushort)(auVar91._0_2_ == local_168);
          auVar14._4_2_ = -(ushort)(auVar91._4_2_ == sStack_164);
          auVar14._6_2_ = -(ushort)(auVar91._6_2_ == sStack_162);
          auVar14._8_2_ = -(ushort)(auVar91._8_2_ == sStack_160);
          auVar14._10_2_ = -(ushort)(auVar91._10_2_ == sStack_15e);
          auVar14._12_2_ = -(ushort)(auVar91._12_2_ == sStack_15c);
          auVar14._14_2_ = -(ushort)(auVar91._14_2_ == sStack_15a);
          auVar47 = auVar47 & auVar14;
          local_228 = pblendvb(local_228,auVar93,auVar47);
          auVar106 = pblendvb(auVar106,auVar92,auVar47);
          auVar113 = pblendvb(auVar113,auVar119,auVar47);
          auVar115 = pblendvb(auVar115,auVar60,auVar47);
          ptr_01[uVar39] = sVar6;
          ptr_02[uVar39] = sVar16;
          ptr_03[uVar39] = sVar42;
          ptr_04[uVar39] = sVar31;
          ptr_05[uVar39] = local_2a8._0_2_;
          ptr_06[uVar39] = auVar131._0_2_;
          ptr_07[uVar39] = local_2b8._0_2_;
          ptr_08[uVar39] = local_2c8._0_2_;
          auVar110 = pmovsxbw(auVar118,0x101010101010101);
          local_218 = paddsw(local_218,auVar110);
          local_1a8._8_8_ = uVar5;
          local_1a8._0_8_ = auVar117._0_8_;
          local_c8 = SUB168(~auVar103 & auVar121,0);
          uStack_c0 = SUB168(~auVar103 & auVar121,8);
          local_e8 = auVar101._0_8_;
          uStack_e0 = auVar101._8_8_;
          auVar101 = auVar45;
          local_278._0_8_ = auVar108._0_8_;
          local_278._8_8_ = uVar4;
        }
        auVar91 = paddsw(auVar91,_DAT_008a1bb0);
        local_238 = psubsw(local_238,auVar73);
        uVar21 = uVar21 + 8;
      }
      iVar29 = 8;
      uVar35 = uVar38;
      uVar20 = uVar38;
      uVar30 = uVar38;
      while( true ) {
        sVar16 = (short)uVar35;
        sVar31 = (short)uVar38;
        sVar18 = (short)uVar20;
        sVar25 = (short)uVar30;
        bVar40 = iVar29 == 0;
        iVar29 = iVar29 + -1;
        if (bVar40) break;
        uVar37 = local_228._0_8_;
        lVar23 = local_228._8_8_;
        uVar21 = auVar106._0_8_;
        lVar22 = auVar106._8_8_;
        uVar33 = auVar113._0_8_;
        lVar114 = auVar113._8_8_;
        uVar39 = auVar115._0_8_;
        lVar116 = auVar115._8_8_;
        if (sVar25 < (short)local_228._14_2_) {
          uVar20 = (uint)auVar106._14_2_;
          uVar38 = (uint)auVar113._14_2_;
          uVar35 = (uint)auVar115._14_2_;
          uVar30 = (uint)local_228._14_2_;
        }
        local_228._0_8_ = uVar37 << 0x10;
        local_228._8_8_ = lVar23 << 0x10 | uVar37 >> 0x30;
        auVar106._0_8_ = uVar21 << 0x10;
        auVar106._8_8_ = lVar22 << 0x10 | uVar21 >> 0x30;
        auVar113._0_8_ = uVar33 << 0x10;
        auVar113._8_8_ = lVar114 << 0x10 | uVar33 >> 0x30;
        auVar115._0_8_ = uVar39 << 0x10;
        auVar115._8_8_ = lVar116 << 0x10 | uVar39 >> 0x30;
      }
      auVar48._0_2_ = -(ushort)((short)local_258 < local_288);
      auVar48._2_2_ = -(ushort)(local_258._2_2_ < sStack_286);
      auVar48._4_2_ = -(ushort)(local_258._4_2_ < local_288);
      auVar48._6_2_ = -(ushort)(local_258._6_2_ < sStack_286);
      auVar48._8_2_ = -(ushort)((short)uStack_250 < local_288);
      auVar48._10_2_ = -(ushort)(uStack_250._2_2_ < sStack_286);
      auVar48._12_2_ = -(ushort)(uStack_250._4_2_ < local_288);
      auVar48._14_2_ = -(ushort)(uStack_250._6_2_ < sStack_286);
      local_1b8 = auVar59._0_2_;
      sStack_1b6 = auVar59._2_2_;
      auVar105._0_2_ = -(ushort)(local_1b8 < (short)local_248._0_2_);
      auVar105._2_2_ = -(ushort)(sStack_1b6 < (short)local_248._2_2_);
      auVar105._4_2_ = -(ushort)(local_1b8 < (short)local_248._4_2_);
      auVar105._6_2_ = -(ushort)(sStack_1b6 < (short)local_248._6_2_);
      auVar105._8_2_ = -(ushort)(local_1b8 < (short)local_248._8_2_);
      auVar105._10_2_ = -(ushort)(sStack_1b6 < (short)local_248._10_2_);
      auVar105._12_2_ = -(ushort)(local_1b8 < (short)local_248._12_2_);
      auVar105._14_2_ = -(ushort)(sStack_1b6 < (short)local_248._14_2_);
      auVar105 = auVar105 | auVar48;
      if ((((((((((((((((auVar105 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar105 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar105 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar105 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar105 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar105 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar105 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar105 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar105 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar105 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar105 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar105 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar105[0xf] < '\0') {
        *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
        sVar31 = 0;
        sVar16 = 0;
        sVar18 = 0;
        sVar25 = 0;
        iVar36 = 0;
        local_324 = 0;
      }
      ppVar17->score = (int)sVar25;
      ppVar17->end_query = local_324;
      ppVar17->end_ref = iVar36;
      *(int *)(ppVar17->field_4).extra = (int)sVar18;
      ((ppVar17->field_4).stats)->similar = (int)sVar31;
      ((ppVar17->field_4).stats)->length = (int)sVar16;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar17;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vNegInf0 = _mm_insert_epi16(vZero, NEG_LIMIT, 7);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
            matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
            similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
            length= (int16_t) _mm_extract_epi16(vMaxL, 7);
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
        vMaxM = _mm_slli_si128(vMaxM, 2);
        vMaxS = _mm_slli_si128(vMaxS, 2);
        vMaxL = _mm_slli_si128(vMaxL, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}